

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

void __thiscall
pbrt::SimplePathIntegrator::SimplePathIntegrator
          (SimplePathIntegrator *this,int maxDepth,bool sampleLights,bool sampleBSDF,
          CameraHandle *camera,SamplerHandle *sampler,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights)

{
  LightHandle *first;
  LightHandle *last;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_68;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_50;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_48;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_40;
  polymorphic_allocator<pbrt::LightHandle> local_38;
  
  local_40.bits =
       (camera->
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       ).bits;
  local_48.bits =
       (sampler->
       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_50.bits =
       (aggregate->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector(&local_68,lights);
  RayIntegrator::RayIntegrator
            (&this->super_RayIntegrator,(CameraHandle *)&local_40,(SamplerHandle *)&local_48,
             (PrimitiveHandle *)&local_50,&local_68);
  if (local_68.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__SimplePathIntegrator_0300b810;
  this->maxDepth = maxDepth;
  this->sampleLights = sampleLights;
  this->sampleBSDF = sampleBSDF;
  first = (lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
          _M_impl.super__Vector_impl_data._M_start;
  last = (lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>)._M_impl
         .super__Vector_impl_data._M_finish;
  local_38.memoryResource = pstd::pmr::new_delete_resource();
  pstd::vector<pbrt::LightHandle,pstd::pmr::polymorphic_allocator<pbrt::LightHandle>>::
  vector<pbrt::LightHandle_const*>
            ((vector<pbrt::LightHandle,pstd::pmr::polymorphic_allocator<pbrt::LightHandle>> *)
             &this->lightSampler,first,last,&local_38);
  return;
}

Assistant:

SimplePathIntegrator::SimplePathIntegrator(int maxDepth, bool sampleLights,
                                           bool sampleBSDF, CameraHandle camera,
                                           SamplerHandle sampler,
                                           PrimitiveHandle aggregate,
                                           std::vector<LightHandle> lights)
    : RayIntegrator(camera, sampler, aggregate, lights),
      maxDepth(maxDepth),
      sampleLights(sampleLights),
      sampleBSDF(sampleBSDF),
      lightSampler(lights, Allocator()) {}